

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O0

void bubble_up(nghttp2_pq *pq,size_t index)

{
  int iVar1;
  ulong i;
  size_t parent;
  size_t index_local;
  nghttp2_pq *pq_local;
  
  parent = index;
  while( true ) {
    if (parent == 0) {
      return;
    }
    i = parent - 1 >> 1;
    iVar1 = (*pq->less)(pq->q[parent],pq->q[i]);
    if (iVar1 == 0) break;
    swap(pq,i,parent);
    parent = i;
  }
  return;
}

Assistant:

static void bubble_up(nghttp2_pq *pq, size_t index) {
  size_t parent;
  while (index != 0) {
    parent = (index - 1) / 2;
    if (!pq->less(pq->q[index], pq->q[parent])) {
      return;
    }
    swap(pq, parent, index);
    index = parent;
  }
}